

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-as.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  Options *this;
  pointer pcVar1;
  undefined8 *puVar2;
  char cVar3;
  int iVar4;
  mapped_type *pmVar5;
  string *psVar6;
  iterator iVar7;
  long *plVar8;
  long *plVar9;
  undefined1 local_bb0 [8];
  ToolOptions options;
  long local_a20;
  undefined4 uStack_a18;
  undefined4 uStack_a14;
  uint local_8b8;
  void *local_868;
  long local_860;
  undefined8 *local_858;
  undefined8 uStack_850;
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined8 local_620;
  undefined1 local_618 [16];
  undefined1 *local_608;
  undefined8 local_600;
  undefined1 local_5f8 [16];
  undefined1 *local_5e8;
  undefined8 local_5e0;
  undefined1 local_5d8 [288];
  undefined1 *local_4b8;
  undefined8 local_4b0;
  code *local_4a8;
  code *local_4a0;
  undefined1 *local_498;
  undefined8 local_490;
  code *local_488;
  code *local_480;
  undefined1 *local_478;
  undefined8 local_470;
  code *local_468;
  code *local_460;
  size_type **local_458;
  undefined8 local_450;
  code *local_448;
  code *local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  code *local_428;
  code *local_420;
  undefined8 local_418;
  undefined8 uStack_410;
  code *local_408;
  code *local_400;
  long *local_3f8;
  long local_3e8 [2];
  char local_3d8;
  long *local_3d0 [2];
  long local_3c0 [2];
  long *local_3b0 [2];
  long local_3a0 [2];
  long *local_390 [2];
  long local_380 [2];
  string local_370;
  string local_350;
  long *local_330 [2];
  long local_320 [2];
  long *local_310 [2];
  long local_300 [2];
  long *local_2f0 [2];
  long local_2e0 [2];
  long *local_2d0 [2];
  long local_2c0 [2];
  char **local_2b0;
  long *local_2a8 [2];
  long local_298 [2];
  long *local_288 [2];
  long local_278 [2];
  long *local_268 [2];
  long local_258 [2];
  long *local_248 [2];
  long local_238 [2];
  long *local_228 [2];
  long local_218 [2];
  long *local_208 [2];
  long local_1f8 [2];
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  long *local_1a8 [2];
  long local_198 [2];
  long *local_188 [2];
  long local_178 [2];
  long *local_168 [2];
  long local_158 [2];
  long *local_148 [2];
  long local_138 [2];
  size_type *local_128;
  string symbolMap;
  string sourceMapFilename;
  string sourceMapUrl;
  string WasmAsOption;
  undefined1 local_a0 [8];
  Result<wasm::Ok> parsed;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  __index_type local_80;
  undefined1 local_78 [32];
  undefined1 auStack_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  bool debugInfo;
  
  input.field_2._M_local_buf[0xf] = '\0';
  local_128 = &symbolMap._M_string_length;
  symbolMap._M_dataplus._M_p = (pointer)0x0;
  symbolMap._M_string_length._0_1_ = 0;
  symbolMap.field_2._8_8_ = &sourceMapFilename._M_string_length;
  sourceMapFilename._M_dataplus._M_p = (pointer)0x0;
  sourceMapFilename._M_string_length._0_1_ = 0;
  sourceMapFilename.field_2._8_8_ = &sourceMapUrl._M_string_length;
  sourceMapUrl._M_dataplus._M_p = (pointer)0x0;
  sourceMapUrl._M_string_length._0_1_ = 0;
  sourceMapUrl.field_2._8_8_ = &WasmAsOption._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&sourceMapUrl.field_2 + 8),"wasm-as options","");
  options._376_8_ = &local_a20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&options.enabledFeatures,"wasm-as","");
  local_640._0_8_ = local_630;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_640,
             "Assemble a .wat (WebAssembly text format) into a .wasm (WebAssembly binary format)",""
            );
  wasm::ToolOptions::ToolOptions
            ((ToolOptions *)local_bb0,(string *)&options.enabledFeatures,(string *)local_640);
  if ((undefined1 *)local_640._0_8_ != local_630) {
    operator_delete((void *)local_640._0_8_,CONCAT62(local_630._2_6_,local_630._0_2_) + 1);
  }
  if ((long *)options._376_8_ != &local_a20) {
    operator_delete((void *)options._376_8_,local_a20 + 1);
  }
  options._376_8_ = &local_a20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&options.enabledFeatures,"validate","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&options.super_Options,(key_type *)&options.enabledFeatures);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x1101e5);
  if ((long *)options._376_8_ != &local_a20) {
    operator_delete((void *)options._376_8_,local_a20 + 1);
  }
  options._376_8_ = &local_a20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&options.enabledFeatures,"--output","");
  local_640._0_8_ = local_630;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_640,"-o","");
  local_a0 = (undefined1  [8])&local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Output file","");
  auStack_58 = (undefined1  [8])0x0;
  input._M_dataplus._M_p = (pointer)0x0;
  input.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:50:10)>
       ::_M_invoke;
  input._M_string_length =
       (size_type)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:50:10)>
       ::_M_manager;
  psVar6 = (string *)
           wasm::Options::add((string *)&options,(string *)&options.enabledFeatures,
                              (string *)local_640,(string *)local_a0,(int)&sourceMapUrl + 0x18,
                              (function *)0x1,SUB81(auStack_58,0));
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"--validate","");
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"-v","");
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_288,"Control validation of the output module","");
  local_438 = 0;
  uStack_430 = 0;
  local_420 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:59:10)>
              ::_M_invoke;
  local_428 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:59:10)>
              ::_M_manager;
  psVar6 = (string *)
           wasm::Options::add(psVar6,(string *)local_78,(string *)local_2a8,(string *)local_288,
                              (int)&sourceMapUrl + 0x18,(function *)0x1,SUB81(&local_438,0));
  local_268[0] = local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"--debuginfo","");
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"-g","");
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_228,"Emit names section and debug info","");
  local_4b0 = 0;
  local_4b8 = (undefined1 *)((long)&input.field_2 + 0xf);
  local_4a0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:71:10)>
              ::_M_invoke;
  local_4a8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:71:10)>
              ::_M_manager;
  psVar6 = (string *)
           wasm::Options::add(psVar6,(string *)local_268,(string *)local_248,(string *)local_228,
                              (int)&sourceMapUrl + 0x18,(function *)0x0,SUB81(&local_4b8,0));
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"--source-map","");
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"-sm","");
  local_1c8[0] = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,"Emit source map to the specified file","");
  local_490 = 0;
  local_498 = (undefined1 *)((long)&symbolMap.field_2 + 8);
  local_480 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:77:10)>
              ::_M_invoke;
  local_488 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:77:10)>
              ::_M_manager;
  psVar6 = (string *)
           wasm::Options::add(psVar6,(string *)local_208,(string *)local_1e8,(string *)local_1c8,
                              (int)&sourceMapUrl + 0x18,(function *)0x1,SUB81(&local_498,0));
  local_1a8[0] = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"--source-map-url","");
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"-su","");
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_168,"Use specified string as source map URL","");
  local_470 = 0;
  local_478 = (undefined1 *)((long)&sourceMapFilename.field_2 + 8);
  local_460 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:85:10)>
              ::_M_invoke;
  local_468 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:85:10)>
              ::_M_manager;
  psVar6 = (string *)
           wasm::Options::add(psVar6,(string *)local_1a8,(string *)local_188,(string *)local_168,
                              (int)&sourceMapUrl + 0x18,(function *)0x1,SUB81(&local_478,0));
  local_148[0] = local_138;
  WasmAsOption.field_2._12_4_ = argc;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"--symbolmap","");
  local_3d0[0] = local_3c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"-s","");
  local_3b0[0] = local_3a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3b0,"Emit a symbol map (indexes => names)","");
  local_450 = 0;
  local_458 = &local_128;
  local_440 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:93:10)>
              ::_M_invoke;
  local_448 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:93:10)>
              ::_M_manager;
  local_2b0 = argv;
  psVar6 = (string *)
           wasm::Options::add(psVar6,(string *)local_148,(string *)local_3d0,(string *)local_3b0,
                              (int)&sourceMapUrl + 0x18,(function *)0x1,SUB81(&local_458,0));
  local_390[0] = local_380;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"INFILE","");
  local_418 = 0;
  uStack_410 = 0;
  local_400 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:96:21)>
              ::_M_invoke;
  local_408 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:96:21)>
              ::_M_manager;
  wasm::Options::add_positional(psVar6,(Arguments)local_390,(function *)0x1);
  this = &options.super_Options;
  if (local_408 != (code *)0x0) {
    (*local_408)(&local_418,&local_418,3);
  }
  if (local_390[0] != local_380) {
    operator_delete(local_390[0],local_380[0] + 1);
  }
  if (local_448 != (code *)0x0) {
    (*local_448)(&local_458,&local_458,3);
  }
  if (local_3b0[0] != local_3a0) {
    operator_delete(local_3b0[0],local_3a0[0] + 1);
  }
  if (local_3d0[0] != local_3c0) {
    operator_delete(local_3d0[0],local_3c0[0] + 1);
  }
  if (local_148[0] != local_138) {
    operator_delete(local_148[0],local_138[0] + 1);
  }
  if (local_468 != (code *)0x0) {
    (*local_468)(&local_478,&local_478,3);
  }
  if (local_168[0] != local_158) {
    operator_delete(local_168[0],local_158[0] + 1);
  }
  if (local_188[0] != local_178) {
    operator_delete(local_188[0],local_178[0] + 1);
  }
  if (local_1a8[0] != local_198) {
    operator_delete(local_1a8[0],local_198[0] + 1);
  }
  if (local_488 != (code *)0x0) {
    (*local_488)(&local_498,&local_498,3);
  }
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  if (local_208[0] != local_1f8) {
    operator_delete(local_208[0],local_1f8[0] + 1);
  }
  if (local_4a8 != (code *)0x0) {
    (*local_4a8)(&local_4b8,&local_4b8,3);
  }
  if (local_228[0] != local_218) {
    operator_delete(local_228[0],local_218[0] + 1);
  }
  if (local_248[0] != local_238) {
    operator_delete(local_248[0],local_238[0] + 1);
  }
  if (local_268[0] != local_258) {
    operator_delete(local_268[0],local_258[0] + 1);
  }
  if (local_428 != (code *)0x0) {
    (*local_428)(&local_438,&local_438,3);
  }
  if (local_288[0] != local_278) {
    operator_delete(local_288[0],local_278[0] + 1);
  }
  if (local_2a8[0] != local_298) {
    operator_delete(local_2a8[0],local_298[0] + 1);
  }
  if ((pointer)local_78._0_8_ != (pointer)(local_78 + 0x10)) {
    operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
  }
  if (input._M_string_length != 0) {
    (*(code *)input._M_string_length)(auStack_58,auStack_58,3);
  }
  if (local_a0 != (undefined1  [8])&local_90) {
    operator_delete((void *)local_a0,local_90._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_640._0_8_ != local_630) {
    operator_delete((void *)local_640._0_8_,CONCAT62(local_630._2_6_,local_630._0_2_) + 1);
  }
  if ((long *)options._376_8_ != &local_a20) {
    operator_delete((void *)options._376_8_,local_a20 + 1);
  }
  wasm::Options::parse((int)&options,(char **)(ulong)(uint)WasmAsOption.field_2._12_4_);
  options._376_8_ = &local_a20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&options.enabledFeatures,"output","");
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,(key_type *)&options.enabledFeatures);
  if ((long *)options._376_8_ != &local_a20) {
    operator_delete((void *)options._376_8_,local_a20 + 1);
  }
  if (iVar7._M_node == (_Base_ptr)&options.field_0x10) {
    local_a0 = (undefined1  [8])&local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"infile","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)this,(key_type *)local_a0);
    pcVar1 = (pmVar5->_M_dataplus)._M_p;
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_370,pcVar1,pcVar1 + pmVar5->_M_string_length);
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,".wat","");
    wasm::removeSpecificSuffix((string *)local_640,&local_370,&local_350);
    plVar8 = (long *)std::__cxx11::string::append(local_640);
    plVar9 = plVar8 + 2;
    if ((long *)*plVar8 == plVar9) {
      local_a20 = *plVar9;
      uStack_a18 = (undefined4)plVar8[3];
      uStack_a14 = *(undefined4 *)((long)plVar8 + 0x1c);
      options._376_8_ = &local_a20;
    }
    else {
      local_a20 = *plVar9;
      options._376_8_ = (long *)*plVar8;
    }
    *plVar8 = (long)plVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    auStack_58 = (undefined1  [8])&input._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"output","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)this,(key_type *)auStack_58);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&options.enabledFeatures);
    if (auStack_58 != (undefined1  [8])&input._M_string_length) {
      operator_delete((void *)auStack_58,input._M_string_length + 1);
    }
    if ((long *)options._376_8_ != &local_a20) {
      operator_delete((void *)options._376_8_,local_a20 + 1);
    }
    if ((undefined1 *)local_640._0_8_ != local_630) {
      operator_delete((void *)local_640._0_8_,CONCAT62(local_630._2_6_,local_630._0_2_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    if (local_a0 != (undefined1  [8])&local_90) {
      operator_delete((void *)local_a0,local_90._M_allocated_capacity + 1);
    }
  }
  options._376_8_ = &local_a20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&options.enabledFeatures,"infile","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)this,(key_type *)&options.enabledFeatures);
  wasm::read_file<std::__cxx11::string>((string *)auStack_58,(BinaryOption)pmVar5);
  if ((long *)options._376_8_ != &local_a20) {
    operator_delete((void *)options._376_8_,local_a20 + 1);
  }
  wasm::Module::Module((Module *)&options.enabledFeatures);
  local_8b8 = ~options.profile & (local_8b8 | options._368_4_);
  local_3d8 = '\0';
  wasm::WATParser::parseModule(local_a0,&options.enabledFeatures,input._M_dataplus._M_p,auStack_58);
  if ((local_3d8 == '\x01') && (local_3d8 = '\0', local_3f8 != local_3e8)) {
    operator_delete(local_3f8,local_3e8[0] + 1);
  }
  if (local_80 != '\x01') {
    if (options.passOptions.passesToSkip._M_h._M_single_bucket._1_1_ == '\0') {
      while (local_858 != (undefined8 *)0x0) {
        puVar2 = (undefined8 *)*local_858;
        operator_delete(local_858,0x20);
        local_858 = puVar2;
      }
      memset(local_868,0,local_860 << 3);
      local_858 = (undefined8 *)0x0;
      uStack_850 = 0;
    }
    local_640._0_8_ = local_630;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_640,"validate","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)this,(key_type *)local_640);
    iVar4 = std::__cxx11::string::compare((char *)pmVar5);
    if ((undefined1 *)local_640._0_8_ != local_630) {
      operator_delete((void *)local_640._0_8_,CONCAT62(local_630._2_6_,local_630._0_2_) + 1);
    }
    if (iVar4 != 0) {
      if ((char)options._vptr_ToolOptions == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Validating...",0xd);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
        std::ostream::put(-0x38);
        std::ostream::flush();
      }
      local_640._0_8_ = local_630;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_640,"validate","");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)this,(key_type *)local_640);
      std::__cxx11::string::compare((char *)pmVar5);
      cVar3 = wasm::WasmValidator::validate((Module *)local_78,(int)&options + 0x178);
      if ((undefined1 *)local_640._0_8_ != local_630) {
        operator_delete((void *)local_640._0_8_,CONCAT62(local_630._2_6_,local_630._0_2_) + 1);
      }
      if (cVar3 == '\0') {
        wasm::Fatal::Fatal((Fatal *)local_640);
        wasm::Fatal::operator<<
                  ((Fatal *)local_640,(char (*) [35])"Error: input module is not valid.\n");
        goto LAB_00108760;
      }
    }
    if ((char)options._vptr_ToolOptions == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"writing...",10);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
      std::ostream::put(-0x38);
      std::ostream::flush();
    }
    local_640._8_8_ = &options.field_0xb0;
    local_620 = 0;
    local_618[0] = 0;
    local_600 = 0;
    local_5f8[0] = 0;
    local_5e0 = 0;
    local_5d8[0] = 0;
    local_630._0_2_ = 1;
    local_640[0] = input.field_2._M_local_buf[0xf];
    local_630._8_8_ = local_618;
    local_608 = local_5f8;
    local_5e8 = local_5d8;
    if (sourceMapFilename._M_dataplus._M_p != (pointer)0x0) {
      local_330[0] = local_320;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_330,symbolMap.field_2._8_8_,
                 sourceMapFilename._M_dataplus._M_p + symbolMap.field_2._8_8_);
      std::__cxx11::string::_M_assign((string *)&local_608);
      if (local_330[0] != local_320) {
        operator_delete(local_330[0],local_320[0] + 1);
      }
      local_310[0] = local_300;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_310,sourceMapFilename.field_2._8_8_,
                 sourceMapUrl._M_dataplus._M_p + sourceMapFilename.field_2._8_8_);
      std::__cxx11::string::_M_assign((string *)&local_5e8);
      if (local_310[0] != local_300) {
        operator_delete(local_310[0],local_300[0] + 1);
      }
    }
    if (symbolMap._M_dataplus._M_p != (pointer)0x0) {
      local_2f0[0] = local_2e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2f0,local_128,symbolMap._M_dataplus._M_p + (long)local_128);
      std::__cxx11::string::_M_assign((string *)(local_630 + 8));
      if (local_2f0[0] != local_2e0) {
        operator_delete(local_2f0[0],local_2e0[0] + 1);
      }
    }
    local_78._0_8_ = local_78 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"output","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)this,(key_type *)local_78);
    pcVar1 = (pmVar5->_M_dataplus)._M_p;
    local_2d0[0] = local_2c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2d0,pcVar1,pcVar1 + pmVar5->_M_string_length);
    wasm::ModuleWriter::write(local_640,&options.enabledFeatures,local_2d0);
    if (local_2d0[0] != local_2c0) {
      operator_delete(local_2d0[0],local_2c0[0] + 1);
    }
    if ((pointer)local_78._0_8_ != (pointer)(local_78 + 0x10)) {
      operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
    }
    if ((char)options._vptr_ToolOptions == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Done.",5);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
      std::ostream::put(-0x38);
      std::ostream::flush();
    }
    if (local_5e8 != local_5d8) {
      operator_delete(local_5e8,CONCAT71(local_5d8._1_7_,local_5d8[0]) + 1);
    }
    if (local_608 != local_5f8) {
      operator_delete(local_608,CONCAT71(local_5f8._1_7_,local_5f8[0]) + 1);
    }
    if ((undefined1 *)local_630._8_8_ != local_618) {
      operator_delete((void *)local_630._8_8_,CONCAT71(local_618._1_7_,local_618[0]) + 1);
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_a0);
    wasm::Module::~Module((Module *)&options.enabledFeatures);
    if (auStack_58 != (undefined1  [8])&input._M_string_length) {
      operator_delete((void *)auStack_58,input._M_string_length + 1);
    }
    wasm::ToolOptions::~ToolOptions((ToolOptions *)local_bb0);
    if ((size_type *)sourceMapUrl.field_2._8_8_ != &WasmAsOption._M_string_length) {
      operator_delete((void *)sourceMapUrl.field_2._8_8_,WasmAsOption._M_string_length + 1);
    }
    if ((size_type *)sourceMapFilename.field_2._8_8_ != &sourceMapUrl._M_string_length) {
      operator_delete((void *)sourceMapFilename.field_2._8_8_,
                      CONCAT71(sourceMapUrl._M_string_length._1_7_,
                               (undefined1)sourceMapUrl._M_string_length) + 1);
    }
    if ((size_type *)symbolMap.field_2._8_8_ != &sourceMapFilename._M_string_length) {
      operator_delete((void *)symbolMap.field_2._8_8_,
                      CONCAT71(sourceMapFilename._M_string_length._1_7_,
                               (undefined1)sourceMapFilename._M_string_length) + 1);
    }
    if (local_128 != &symbolMap._M_string_length) {
      operator_delete(local_128,
                      CONCAT71(symbolMap._M_string_length._1_7_,
                               (undefined1)symbolMap._M_string_length) + 1);
    }
    return 0;
  }
  wasm::Fatal::Fatal((Fatal *)local_640);
  wasm::Fatal::operator<<
            ((Fatal *)local_640,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
LAB_00108760:
  wasm::Fatal::~Fatal((Fatal *)local_640);
}

Assistant:

int main(int argc, const char* argv[]) {
  bool debugInfo = false;
  std::string symbolMap;
  std::string sourceMapFilename;
  std::string sourceMapUrl;

  const std::string WasmAsOption = "wasm-as options";

  ToolOptions options("wasm-as",
                      "Assemble a .wat (WebAssembly text format) into a .wasm "
                      "(WebAssembly binary format)");
  options.extra["validate"] = "wasm";
  options
    .add("--output",
         "-o",
         "Output file",
         WasmAsOption,
         Options::Arguments::One,
         [](Options* o, const std::string& argument) {
           o->extra["output"] = argument;
           Colors::setEnabled(false);
         })
    .add("--validate",
         "-v",
         "Control validation of the output module",
         WasmAsOption,
         Options::Arguments::One,
         [](Options* o, const std::string& argument) {
           if (argument != "web" && argument != "none" && argument != "wasm") {
             Fatal() << "Valid arguments for --validate flag are 'wasm', "
                        "'web', and 'none'.\n";
           }
           o->extra["validate"] = argument;
         })
    .add("--debuginfo",
         "-g",
         "Emit names section and debug info",
         WasmAsOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arguments) { debugInfo = true; })
    .add("--source-map",
         "-sm",
         "Emit source map to the specified file",
         WasmAsOption,
         Options::Arguments::One,
         [&sourceMapFilename](Options* o, const std::string& argument) {
           sourceMapFilename = argument;
         })
    .add("--source-map-url",
         "-su",
         "Use specified string as source map URL",
         WasmAsOption,
         Options::Arguments::One,
         [&sourceMapUrl](Options* o, const std::string& argument) {
           sourceMapUrl = argument;
         })
    .add("--symbolmap",
         "-s",
         "Emit a symbol map (indexes => names)",
         WasmAsOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { symbolMap = argument; })
    .add_positional("INFILE",
                    Options::Arguments::One,
                    [](Options* o, const std::string& argument) {
                      o->extra["infile"] = argument;
                    });
  options.parse(argc, argv);

  // default output is infile with changed suffix
  if (options.extra.find("output") == options.extra.end()) {
    options.extra["output"] =
      removeSpecificSuffix(options.extra["infile"], ".wat") + ".wasm";
  }

  auto input(read_file<std::string>(options.extra["infile"], Flags::Text));

  Module wasm;
  options.applyOptionsBeforeParse(wasm);

  auto parsed = WATParser::parseModule(wasm, input);
  if (auto* err = parsed.getErr()) {
    Fatal() << err->msg;
  }

  options.applyOptionsAfterParse(wasm);

  if (options.extra["validate"] != "none") {
    if (options.debug) {
      std::cerr << "Validating..." << std::endl;
    }
    if (!wasm::WasmValidator().validate(
          wasm,
          WasmValidator::Globally |
            (options.extra["validate"] == "web" ? WasmValidator::Web : 0))) {
      Fatal() << "Error: input module is not valid.\n";
    }
  }

  if (options.debug) {
    std::cerr << "writing..." << std::endl;
  }
  ModuleWriter writer(options.passOptions);
  writer.setBinary(true);
  writer.setDebugInfo(debugInfo);
  if (sourceMapFilename.size()) {
    writer.setSourceMapFilename(sourceMapFilename);
    writer.setSourceMapUrl(sourceMapUrl);
  }
  if (symbolMap.size() > 0) {
    writer.setSymbolMap(symbolMap);
  }
  writer.write(wasm, options.extra["output"]);

  if (options.debug) {
    std::cerr << "Done." << std::endl;
  }
}